

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumnIdx IVar3;
  int iVar4;
  char *pcVar5;
  ImGuiTableColumn *pIVar6;
  ImGuiTableColumn *pIVar7;
  char *b;
  bool local_2c;
  bool local_2b;
  int local_24;
  int order_n;
  int column_n;
  ImGuiTable *table;
  ImGuiContext *g;
  int rows_local;
  int columns_local;
  
  pIVar2 = GImGui->CurrentTable;
  if (pIVar2 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableSetupColumn() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x5bd,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if ((pIVar2->IsLayoutLocked & 1U) != 0) {
    __assert_fail("table->IsLayoutLocked == false && \"Need to call TableSetupColumn() before first row!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x5be,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  local_2b = 0x3f < (uint)columns;
  if (local_2b) {
    __assert_fail("columns >= 0 && columns < 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x5bf,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  local_2c = (uint)rows < 0x80;
  if (local_2c) {
    if ((pIVar2->Flags & 0x1000000U) == 0) {
      IVar3 = '\0';
    }
    else {
      iVar4 = ImMin<int>(columns,pIVar2->ColumnsCount);
      IVar3 = (ImGuiTableColumnIdx)iVar4;
    }
    pIVar2->FreezeColumnsRequest = IVar3;
    fVar1 = (pIVar2->InnerWindow->Scroll).x;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      IVar3 = pIVar2->FreezeColumnsRequest;
    }
    else {
      IVar3 = '\0';
    }
    pIVar2->FreezeColumnsCount = IVar3;
    if ((pIVar2->Flags & 0x2000000U) == 0) {
      IVar3 = '\0';
    }
    else {
      IVar3 = (ImGuiTableColumnIdx)rows;
    }
    pIVar2->FreezeRowsRequest = IVar3;
    fVar1 = (pIVar2->InnerWindow->Scroll).y;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      IVar3 = pIVar2->FreezeRowsRequest;
    }
    else {
      IVar3 = '\0';
    }
    pIVar2->FreezeRowsCount = IVar3;
    pIVar2->IsUnfrozenRows = pIVar2->FreezeRowsCount == '\0';
    for (local_24 = 0; local_24 < pIVar2->FreezeColumnsRequest; local_24 = local_24 + 1) {
      pcVar5 = ImSpan<signed_char>::operator[](&pIVar2->DisplayOrderToIndex,local_24);
      iVar4 = (int)*pcVar5;
      if ((iVar4 != local_24) && (pIVar2->FreezeColumnsRequest <= iVar4)) {
        pcVar5 = ImSpan<signed_char>::operator[](&pIVar2->DisplayOrderToIndex,iVar4);
        pIVar6 = ImSpan<ImGuiTableColumn>::operator[](&pIVar2->Columns,(int)*pcVar5);
        pcVar5 = ImSpan<signed_char>::operator[](&pIVar2->DisplayOrderToIndex,local_24);
        pIVar7 = ImSpan<ImGuiTableColumn>::operator[](&pIVar2->Columns,(int)*pcVar5);
        ImSwap<signed_char>(&pIVar6->DisplayOrder,&pIVar7->DisplayOrder);
        pcVar5 = ImSpan<signed_char>::operator[](&pIVar2->DisplayOrderToIndex,iVar4);
        b = ImSpan<signed_char>::operator[](&pIVar2->DisplayOrderToIndex,local_24);
        ImSwap<signed_char>(pcVar5,b);
      }
    }
    return;
  }
  __assert_fail("rows >= 0 && rows < 128",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                ,0x5c0,"void ImGui::TableSetupScrollFreeze(int, int)");
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)ImMin(columns, table->ColumnsCount) : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b

    // Ensure frozen columns are ordered in their section. We still allow multiple frozen columns to be reordered.
    // FIXME-TABLE: This work for preserving 2143 into 21|43. How about 4321 turning into 21|43? (preserve relative order in each section)
    for (int column_n = 0; column_n < table->FreezeColumnsRequest; column_n++)
    {
        int order_n = table->DisplayOrderToIndex[column_n];
        if (order_n != column_n && order_n >= table->FreezeColumnsRequest)
        {
            ImSwap(table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder, table->Columns[table->DisplayOrderToIndex[column_n]].DisplayOrder);
            ImSwap(table->DisplayOrderToIndex[order_n], table->DisplayOrderToIndex[column_n]);
        }
    }
}